

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

Vec_Int_t *
Acb_NtkCollectCopies(Acb_Ntk_t *p,Gia_Man_t *pGia,Vec_Ptr_t **pvNodesR,Vec_Bit_t **pvPolar)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Ptr_t *p_02;
  Vec_Bit_t *p_03;
  Vec_Bit_t *p_04;
  Gia_Man_t *pObj;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  void *pvVar6;
  int iVar7;
  int i;
  Vec_Int_t *p_05;
  int iVar8;
  uint v;
  
  iVar8 = (p->vTargets).nSize;
  pObj = pGia;
  p_00 = Acb_NtkFindNodes2(p);
  p_01 = Vec_IntAlloc((p->vObjType).nSize + -1);
  p_02 = Vec_PtrStart(pGia->nObjs);
  p_03 = Vec_BitStart(pGia->nObjs);
  p_04 = Vec_BitStart(pGia->nObjs);
  for (iVar7 = 0; iVar7 < pGia->vCis->nSize; iVar7 = iVar7 + 1) {
    pObj = (Gia_Man_t *)Gia_ManCi(pGia,iVar7);
    uVar1 = Gia_ObjId(pGia,(Gia_Obj_t *)pObj);
    if (uVar1 == 0) break;
    iVar2 = pGia->vCis->nSize;
    p_05 = &p->vCis;
    i = iVar7;
    if (iVar2 - iVar8 <= iVar7) {
      p_05 = &p->vTargets;
      i = (iVar8 + iVar7) - iVar2;
    }
    iVar2 = Vec_IntEntry(p_05,i);
    pcVar4 = Acb_ObjNameStr(p,iVar2);
    pcVar4 = Abc_UtilStrsav(pcVar4);
    pObj = (Gia_Man_t *)(ulong)uVar1;
    Vec_PtrWriteEntry(p_02,uVar1,pcVar4);
  }
  for (iVar8 = 0; iVar8 < pGia->vCos->nSize; iVar8 = iVar8 + 1) {
    pObj = (Gia_Man_t *)Gia_ManCo(pGia,iVar8);
    uVar1 = Gia_ObjId(pGia,(Gia_Obj_t *)pObj);
    if (uVar1 == 0) break;
    pGVar5 = Gia_ManObj(pGia,uVar1);
    Vec_BitWriteEntry(p_03,uVar1 - (*(uint *)pGVar5 & 0x1fffffff),1);
    iVar7 = Vec_IntEntry(&p->vCos,iVar8);
    pcVar4 = Acb_ObjNameStr(p,iVar7);
    pcVar4 = Abc_UtilStrsav(pcVar4);
    Vec_PtrWriteEntry(p_02,uVar1,pcVar4);
    pObj = (Gia_Man_t *)(ulong)uVar1;
    Vec_IntPush(p_01,uVar1);
  }
  iVar8 = p_00->nSize;
  iVar7 = 0;
  if (iVar8 < 1) {
    iVar8 = 0;
  }
  for (; iVar2 = (int)pObj, iVar8 != iVar7; iVar7 = iVar7 + 1) {
    uVar1 = Vec_IntEntry(p_00,iVar7);
    pObj = (Gia_Man_t *)(ulong)uVar1;
    uVar3 = Acb_ObjCopy(p,uVar1);
    if (-1 < (int)uVar3) {
      v = uVar3 >> 1;
      pObj = (Gia_Man_t *)(ulong)v;
      pGVar5 = Gia_ManObj(pGia,v);
      if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
        pObj = (Gia_Man_t *)(ulong)v;
        iVar2 = Vec_BitEntry(p_03,v);
        if (iVar2 == 0) {
          pObj = (Gia_Man_t *)(ulong)v;
          pvVar6 = Vec_PtrEntry(p_02,v);
          if (pvVar6 == (void *)0x0) {
            pcVar4 = Acb_ObjNameStr(p,uVar1);
            pcVar4 = Abc_UtilStrsav(pcVar4);
            Vec_PtrWriteEntry(p_02,v,pcVar4);
            Vec_IntPush(p_01,v);
            pObj = (Gia_Man_t *)(ulong)v;
            Vec_BitWriteEntry(p_04,v,uVar3 & 1);
          }
        }
      }
    }
  }
  Vec_BitFree(p_03);
  Vec_IntFree(p_00);
  Vec_IntSort(p_01,iVar2);
  *pvNodesR = p_02;
  *pvPolar = p_04;
  return p_01;
}

Assistant:

Vec_Int_t * Acb_NtkCollectCopies( Acb_Ntk_t * p, Gia_Man_t * pGia, Vec_Ptr_t ** pvNodesR, Vec_Bit_t ** pvPolar )
{
    int i, iObj, iLit, nTargets = Vec_IntSize(&p->vTargets);
    Vec_Int_t * vObjs   = Acb_NtkFindNodes2( p );
    Vec_Int_t * vNodes  = Vec_IntAlloc( Acb_NtkObjNum(p) );
    Vec_Ptr_t * vNodesR = Vec_PtrStart( Gia_ManObjNum(pGia) );
    Vec_Bit_t * vDriver = Vec_BitStart( Gia_ManObjNum(pGia) );
    Vec_Bit_t * vPolar  = Vec_BitStart( Gia_ManObjNum(pGia) );
    Gia_ManForEachCiId( pGia, iObj, i )
        if ( i < Gia_ManCiNum(pGia) - nTargets )
            Vec_PtrWriteEntry( vNodesR, iObj, Abc_UtilStrsav(Acb_ObjNameStr(p, Acb_NtkCi(p, i))) );
        else
            Vec_PtrWriteEntry( vNodesR, iObj, Abc_UtilStrsav(Acb_ObjNameStr(p, Vec_IntEntry(&p->vTargets, i-(Gia_ManCiNum(pGia) - nTargets)))) );
    Gia_ManForEachCoId( pGia, iObj, i )
    {
        Vec_BitWriteEntry( vDriver, Gia_ObjFaninId0(Gia_ManObj(pGia, iObj), iObj), 1 );
        Vec_PtrWriteEntry( vNodesR, iObj, Abc_UtilStrsav(Acb_ObjNameStr(p, Acb_NtkCo(p, i))) );
        Vec_IntPush( vNodes, iObj );
    }
    Vec_IntForEachEntry( vObjs, iObj, i )
        if ( (iLit = Acb_ObjCopy(p, iObj)) >= 0 && Gia_ObjIsAnd(Gia_ManObj(pGia, Abc_Lit2Var(iLit))) )
        {
            if ( !Vec_BitEntry(vDriver, Abc_Lit2Var(iLit)) && Vec_PtrEntry(vNodesR, Abc_Lit2Var(iLit)) == NULL )
            {
                Vec_PtrWriteEntry( vNodesR, Abc_Lit2Var(iLit), Abc_UtilStrsav(Acb_ObjNameStr(p, iObj)) );
                Vec_IntPush( vNodes, Abc_Lit2Var(iLit) );
                Vec_BitWriteEntry( vPolar, Abc_Lit2Var(iLit), Abc_LitIsCompl(iLit) );
            }
        }
    Vec_BitFree( vDriver );
    Vec_IntFree( vObjs );
    Vec_IntSort( vNodes, 0 );
    *pvNodesR = vNodesR;
    *pvPolar  = vPolar;
    return vNodes;
}